

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall
cmTargetInternals::ComputeLinkInterface
          (cmTargetInternals *this,cmTarget *thisTarget,string *config,OptionalLinkInterface *iface,
          cmTarget *headTarget)

{
  cmTarget *pcVar1;
  pointer **pppp_Var2;
  PolicyStatus PVar3;
  LinkImplementation *pLVar4;
  LinkImplementationLibraries *pLVar5;
  char *pcVar6;
  pointer __x;
  pointer __obj;
  pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  __p;
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  emitted;
  size_type __dnew_1;
  size_type __dnew;
  undefined1 local_b0 [32];
  hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  local_90;
  string *local_68;
  size_type local_60;
  string local_58;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *local_38;
  
  if (iface->ExplicitLibraries == (char *)0x0) {
    PVar3 = cmPolicies::PolicyMap::Get(&thisTarget->PolicyMap,CMP0022);
    if ((PVar3 == WARN) ||
       (PVar3 = cmPolicies::PolicyMap::Get(&thisTarget->PolicyMap,CMP0022), PVar3 == OLD)) {
      pLVar5 = cmTarget::GetLinkImplementationLibrariesInternal(thisTarget,config,headTarget);
      (iface->super_LinkInterface).ImplementationIsInterface = true;
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::operator=
                (&(iface->super_LinkInterface).WrongConfigLibraries,&pLVar5->WrongConfigLibraries);
    }
  }
  else if ((thisTarget->TargetTypeValue < UNKNOWN_LIBRARY) &&
          ((0x86U >> (thisTarget->TargetTypeValue & 0x1f) & 1) != 0)) {
    local_68 = config;
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::hashtable(&local_90,100,
                (hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_b0,
                (equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_58,(allocator_type *)&local_60);
    __obj = (iface->super_LinkInterface).super_LinkInterfaceLibraries.Libraries.
            super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
            super__Vector_impl_data._M_start;
    if (__obj != (iface->super_LinkInterface).super_LinkInterfaceLibraries.Libraries.
                 super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
      do {
        cmsys::
        hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
        ::resize(&local_90,local_90._M_num_elements + 1);
        cmsys::
        hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
        ::insert_unique_noresize
                  ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                    *)local_b0,&local_90,&__obj->super_string);
        __obj = __obj + 1;
      } while (__obj != (iface->super_LinkInterface).super_LinkInterfaceLibraries.Libraries.
                        super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                        super__Vector_impl_data._M_finish);
    }
    if (thisTarget->TargetTypeValue != INTERFACE_LIBRARY) {
      pLVar4 = cmTarget::GetLinkImplementation(thisTarget,local_68);
      __x = (pLVar4->super_LinkImplementationLibraries).Libraries.
            super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
            super__Vector_impl_data._M_start;
      if (__x != (pLVar4->super_LinkImplementationLibraries).Libraries.
                 super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
        local_38 = &(iface->super_LinkInterface).SharedDeps;
        do {
          cmsys::
          hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
          ::resize(&local_90,local_90._M_num_elements + 1);
          cmsys::
          hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
          ::insert_unique_noresize
                    ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                      *)local_b0,&local_90,(value_type *)__x);
          if ((((bool)local_b0[0x10] == true) &&
              (pcVar1 = (__x->super_cmLinkItem).Target, pcVar1 != (cmTarget *)0x0)) &&
             (pcVar1->TargetTypeValue == SHARED_LIBRARY)) {
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::push_back
                      (local_38,&__x->super_cmLinkItem);
          }
          __x = __x + 1;
        } while (__x != (pLVar4->super_LinkImplementationLibraries).Libraries.
                        super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                        super__Vector_impl_data._M_finish);
      }
    }
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::~hashtable(&local_90);
    config = local_68;
  }
  if ((thisTarget->TargetTypeValue == STATIC_LIBRARY) &&
     (pLVar4 = cmTarget::GetLinkImplementation(thisTarget,config),
     pLVar4 != (LinkImplementation *)0x0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(iface->super_LinkInterface).Languages,&pLVar4->Languages);
  }
  if (thisTarget->TargetTypeValue != STATIC_LIBRARY) {
    return;
  }
  pppp_Var2 = (pointer **)
              &local_90._M_buckets.
               super__Vector_base<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  local_90._M_buckets.
  super__Vector_base<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0x5f;
  local_90._M_buckets.
  super__Vector_base<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
  local_90._0_8_ = pppp_Var2;
  if (config->_M_string_length == 0) {
    std::__cxx11::string::append((char *)&local_90);
  }
  else {
    cmsys::SystemTools::UpperCase((string *)local_b0,config);
    std::__cxx11::string::_M_append((char *)&local_90,local_b0._0_8_);
    if ((_Node *)local_b0._0_8_ != (_Node *)(local_b0 + 0x10)) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
  }
  local_58._M_dataplus._M_p = (char *)0x1b;
  local_b0._0_8_ = (_Node *)(local_b0 + 0x10);
  local_b0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_b0,(ulong)&local_58);
  local_b0._16_8_ = local_58._M_dataplus._M_p;
  builtin_strncpy((char *)((long)&(((_Node *)local_b0._0_8_)->_M_val)._M_dataplus._M_p + 3),
                  "ACE_MULT",8);
  builtin_strncpy((char *)((long)&(((_Node *)local_b0._0_8_)->_M_val)._M_string_length + 3),
                  "IPLICITY",8);
  ((_Node *)local_b0._0_8_)->_M_next =
       (_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x544e495f4b4e494c;
  (((_Node *)local_b0._0_8_)->_M_val)._M_dataplus._M_p = (pointer)0x4d5f454341465245;
  local_b0._8_8_ = local_58._M_dataplus._M_p;
  local_58._M_dataplus._M_p[(long)&((_Node *)local_b0._0_8_)->_M_next] = '\0';
  std::__cxx11::string::_M_append(local_b0,local_90._0_8_);
  pcVar6 = cmTarget::GetProperty(thisTarget,(string *)local_b0,thisTarget->Makefile);
  if (pcVar6 == (char *)0x0) {
    local_60 = 0x1b;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_60);
    local_58.field_2._M_allocated_capacity = local_60;
    builtin_strncpy(local_58._M_dataplus._M_p,"LINK_INTERFACE_MULTIPLICITY",0x1b);
    local_58._M_string_length = local_60;
    local_58._M_dataplus._M_p[local_60] = '\0';
    pcVar6 = cmTarget::GetProperty(thisTarget,&local_58,thisTarget->Makefile);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (pcVar6 == (char *)0x0) goto LAB_002ae3b0;
  }
  __isoc99_sscanf(pcVar6,"%u",&(iface->super_LinkInterface).Multiplicity);
LAB_002ae3b0:
  if ((_Node *)local_b0._0_8_ != (_Node *)(local_b0 + 0x10)) {
    operator_delete((void *)local_b0._0_8_,(ulong)(local_b0._16_8_ + 1));
  }
  if ((pointer **)local_90._0_8_ != pppp_Var2) {
    operator_delete((void *)local_90._0_8_,
                    CONCAT62(local_90._M_buckets.
                             super__Vector_base<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish._2_6_,
                             local_90._M_buckets.
                             super__Vector_base<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish._0_2_) + 1);
  }
  return;
}

Assistant:

void cmTargetInternals::ComputeLinkInterface(cmTarget const* thisTarget,
                                             const std::string& config,
                                             OptionalLinkInterface& iface,
                                             cmTarget const* headTarget) const
{
  if(iface.ExplicitLibraries)
    {
    if(thisTarget->GetType() == cmTarget::SHARED_LIBRARY
        || thisTarget->GetType() == cmTarget::STATIC_LIBRARY
        || thisTarget->GetType() == cmTarget::INTERFACE_LIBRARY)
      {
      // Shared libraries may have runtime implementation dependencies
      // on other shared libraries that are not in the interface.
      UNORDERED_SET<std::string> emitted;
      for(std::vector<cmLinkItem>::const_iterator
          li = iface.Libraries.begin(); li != iface.Libraries.end(); ++li)
        {
        emitted.insert(*li);
        }
      if (thisTarget->GetType() != cmTarget::INTERFACE_LIBRARY)
        {
        cmTarget::LinkImplementation const* impl =
            thisTarget->GetLinkImplementation(config);
        for(std::vector<cmLinkImplItem>::const_iterator
              li = impl->Libraries.begin(); li != impl->Libraries.end(); ++li)
          {
          if(emitted.insert(*li).second)
            {
            if(li->Target)
              {
              // This is a runtime dependency on another shared library.
              if(li->Target->GetType() == cmTarget::SHARED_LIBRARY)
                {
                iface.SharedDeps.push_back(*li);
                }
              }
            else
              {
              // TODO: Recognize shared library file names.  Perhaps this
              // should be moved to cmComputeLinkInformation, but that creates
              // a chicken-and-egg problem since this list is needed for its
              // construction.
              }
            }
          }
        }
      }
    }
  else if (thisTarget->GetPolicyStatusCMP0022() == cmPolicies::WARN
        || thisTarget->GetPolicyStatusCMP0022() == cmPolicies::OLD)
    {
    // The link implementation is the default link interface.
    cmTarget::LinkImplementationLibraries const*
      impl = thisTarget->GetLinkImplementationLibrariesInternal(config,
                                                                headTarget);
    iface.ImplementationIsInterface = true;
    iface.WrongConfigLibraries = impl->WrongConfigLibraries;
    }

  if(thisTarget->LinkLanguagePropagatesToDependents())
    {
    // Targets using this archive need its language runtime libraries.
    if(cmTarget::LinkImplementation const* impl =
       thisTarget->GetLinkImplementation(config))
      {
      iface.Languages = impl->Languages;
      }
    }

  if(thisTarget->GetType() == cmTarget::STATIC_LIBRARY)
    {
    // Construct the property name suffix for this configuration.
    std::string suffix = "_";
    if(!config.empty())
      {
      suffix += cmSystemTools::UpperCase(config);
      }
    else
      {
      suffix += "NOCONFIG";
      }

    // How many repetitions are needed if this library has cyclic
    // dependencies?
    std::string propName = "LINK_INTERFACE_MULTIPLICITY";
    propName += suffix;
    if(const char* config_reps = thisTarget->GetProperty(propName))
      {
      sscanf(config_reps, "%u", &iface.Multiplicity);
      }
    else if(const char* reps =
            thisTarget->GetProperty("LINK_INTERFACE_MULTIPLICITY"))
      {
      sscanf(reps, "%u", &iface.Multiplicity);
      }
    }
}